

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O1

string * __thiscall
jsoncons::jsonpath::detail::
union_selector<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
::to_string_abi_cxx11_(string *__return_storage_ptr__,void *this,int level)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (0 < level) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_replace_aux
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,
               (char)level * '\x02');
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  puVar2 = *(undefined8 **)((long)this + 0x18);
  puVar1 = *(undefined8 **)((long)this + 0x20);
  if (puVar2 != puVar1) {
    do {
      (**(code **)(*(long *)*puVar2 + 0x28))(local_50,(long *)*puVar2,level + 1);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(int level) const override
        {
            std::string s;
            if (level > 0)
            {
                s.append("\n");
                s.append(std::size_t(level)*2, ' ');
            }
            s.append("union selector ");
            for (auto& selector : selectors_)
            {
                s.append(selector->to_string(level+1));
                //s.push_back('\n');
            }

            return s;
        }